

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::
SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>::
emplaceRealloc<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
          (SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
           *this,pointer pos,
          pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  iterator __result;
  unsigned_long *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>
  *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
          ::max_size((SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
                      *)0xf0abeb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
          ::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppVar4 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
           ::begin(in_RDI);
  lVar5 = (long)__last - (long)ppVar4;
  ppVar6 = (pointer)operator_new(0xf0ac4d);
  ppVar7 = ppVar6 + lVar5 / 0x18;
  (ppVar7->first).first = *in_RDX;
  (ppVar7->first).second = in_RDX[1];
  ppVar7->second = (ValueDriver *)in_RDX[2];
  ppVar4 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
           ::end(in_RDI);
  if (in_RSI == ppVar4) {
    __result = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
               ::begin(in_RDI);
    ppVar4 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*,std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
    ::begin(in_RDI);
    std::
    uninitialized_move<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*,std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ppVar4 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*,std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  ::cleanup(in_RDI,(EVP_PKEY_CTX *)ppVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppVar6;
  return ppVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}